

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O0

uint8_t * google::protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                    (UnknownFieldSet *unknown_fields,uint8_t *target,EpsCopyOutputStream *stream)

{
  uint8_t *puVar1;
  bool bVar2;
  string_view s;
  EpsCopyOutputStream *this;
  ptrdiff_t pVar3;
  int iVar4;
  Type TVar5;
  uint32_t uVar6;
  int iVar7;
  uint64_t uVar8;
  const_pointer __src;
  UnknownFieldSet *unknown_fields_00;
  byte *__dest;
  string_view local_90;
  UnknownField *local_80;
  UnknownField *field;
  EpsCopyOutputStream *pEStack_70;
  int i;
  EpsCopyOutputStream *stream_local;
  uint8_t *target_local;
  UnknownFieldSet *unknown_fields_local;
  char *local_50;
  size_type local_48;
  ptrdiff_t size;
  basic_string_view<char,_std::char_traits<char>_> *local_38;
  uint32_t local_2c;
  EpsCopyOutputStream *local_28;
  EpsCopyOutputStream *local_20;
  byte *local_18;
  uint local_c;
  
  pEStack_70 = stream;
  stream_local = (EpsCopyOutputStream *)target;
  target_local = (uint8_t *)unknown_fields;
  for (field._4_4_ = 0; iVar7 = field._4_4_,
      iVar4 = UnknownFieldSet::field_count((UnknownFieldSet *)target_local), iVar7 < iVar4;
      field._4_4_ = field._4_4_ + 1) {
    local_80 = UnknownFieldSet::field((UnknownFieldSet *)target_local,field._4_4_);
    stream_local = (EpsCopyOutputStream *)
                   io::EpsCopyOutputStream::EnsureSpace(pEStack_70,(uint8_t *)stream_local);
    TVar5 = UnknownField::type(local_80);
    this = pEStack_70;
    switch(TVar5) {
    case TYPE_VARINT:
      iVar7 = UnknownField::number(local_80);
      uVar8 = UnknownField::varint(local_80);
      stream_local = (EpsCopyOutputStream *)
                     WireFormatLite::WriteUInt64ToArray(iVar7,uVar8,(uint8_t *)stream_local);
      break;
    case TYPE_FIXED32:
      iVar7 = UnknownField::number(local_80);
      uVar6 = UnknownField::fixed32(local_80);
      stream_local = (EpsCopyOutputStream *)
                     WireFormatLite::WriteFixed32ToArray(iVar7,uVar6,(uint8_t *)stream_local);
      break;
    case TYPE_FIXED64:
      iVar7 = UnknownField::number(local_80);
      uVar8 = UnknownField::fixed64(local_80);
      stream_local = (EpsCopyOutputStream *)
                     WireFormatLite::WriteFixed64ToArray(iVar7,uVar8,(uint8_t *)stream_local);
      break;
    case TYPE_LENGTH_DELIMITED:
      uVar6 = UnknownField::number(local_80);
      local_90 = UnknownField::length_delimited(local_80);
      local_28 = this;
      local_38 = &local_90;
      size = (ptrdiff_t)stream_local;
      local_2c = uVar6;
      local_48 = std::basic_string_view<char,_std::char_traits<char>_>::size(local_38);
      pVar3 = size;
      bVar2 = true;
      if ((long)local_48 < 0x80) {
        puVar1 = this->end_;
        iVar7 = io::EpsCopyOutputStream::TagSize(local_2c << 3);
        bVar2 = (long)(puVar1 + (-(long)iVar7 - pVar3) + 0xf) < (long)local_48;
      }
      if (bVar2) {
        unknown_fields_local = (UnknownFieldSet *)local_38->_M_len;
        local_50 = local_38->_M_str;
        s._M_len = local_38->_M_len;
        s._M_str = local_38->_M_str;
        local_20 = (EpsCopyOutputStream *)
                   io::EpsCopyOutputStream::WriteStringOutline(this,local_2c,s,(uint8_t *)size);
      }
      else {
        local_18 = (byte *)size;
        for (local_c = local_2c << 3 | 2; 0x7f < local_c; local_c = local_c >> 7) {
          *local_18 = (byte)local_c | 0x80;
          local_18 = local_18 + 1;
        }
        *local_18 = (byte)local_c;
        __dest = local_18 + 2;
        local_18[1] = (byte)local_48;
        size = (ptrdiff_t)__dest;
        local_18 = local_18 + 1;
        __src = std::basic_string_view<char,_std::char_traits<char>_>::data(local_38);
        memcpy(__dest,__src,local_48);
        local_20 = (EpsCopyOutputStream *)(size + local_48);
      }
      stream_local = local_20;
      break;
    case TYPE_GROUP:
      iVar7 = UnknownField::number(local_80);
      stream_local = (EpsCopyOutputStream *)
                     WireFormatLite::WriteTagToArray
                               (iVar7,WIRETYPE_START_GROUP,(uint8_t *)stream_local);
      unknown_fields_00 = UnknownField::group(local_80);
      stream_local = (EpsCopyOutputStream *)
                     InternalSerializeUnknownFieldsToArray
                               (unknown_fields_00,(uint8_t *)stream_local,pEStack_70);
      stream_local = (EpsCopyOutputStream *)
                     io::EpsCopyOutputStream::EnsureSpace(pEStack_70,(uint8_t *)stream_local);
      iVar7 = UnknownField::number(local_80);
      stream_local = (EpsCopyOutputStream *)
                     WireFormatLite::WriteTagToArray
                               (iVar7,WIRETYPE_END_GROUP,(uint8_t *)stream_local);
    }
  }
  return (uint8_t *)stream_local;
}

Assistant:

uint8_t* WireFormat::InternalSerializeUnknownFieldsToArray(
    const UnknownFieldSet& unknown_fields, uint8_t* target,
    io::EpsCopyOutputStream* stream) {
  for (int i = 0; i < unknown_fields.field_count(); i++) {
    const UnknownField& field = unknown_fields.field(i);

    target = stream->EnsureSpace(target);
    switch (field.type()) {
      case UnknownField::TYPE_VARINT:
        target = WireFormatLite::WriteUInt64ToArray(field.number(),
                                                    field.varint(), target);
        break;
      case UnknownField::TYPE_FIXED32:
        target = WireFormatLite::WriteFixed32ToArray(field.number(),
                                                     field.fixed32(), target);
        break;
      case UnknownField::TYPE_FIXED64:
        target = WireFormatLite::WriteFixed64ToArray(field.number(),
                                                     field.fixed64(), target);
        break;
      case UnknownField::TYPE_LENGTH_DELIMITED:
        target = stream->WriteString(field.number(), field.length_delimited(),
                                     target);
        break;
      case UnknownField::TYPE_GROUP:
        target = WireFormatLite::WriteTagToArray(
            field.number(), WireFormatLite::WIRETYPE_START_GROUP, target);
        target = InternalSerializeUnknownFieldsToArray(field.group(), target,
                                                       stream);
        target = stream->EnsureSpace(target);
        target = WireFormatLite::WriteTagToArray(
            field.number(), WireFormatLite::WIRETYPE_END_GROUP, target);
        break;
    }
  }
  return target;
}